

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O3

bool __thiscall
slang::ast::InstanceCacheKey::operator==(InstanceCacheKey *this,InstanceCacheKey *other)

{
  InstanceBodySymbol *pIVar1;
  pointer ppPVar2;
  size_t sVar3;
  pointer ppPVar4;
  ParameterSymbolBase *pPVar5;
  ParameterSymbol *this_00;
  pointer ppVar6;
  long lVar7;
  long lVar8;
  size_t __n;
  bool bVar9;
  int iVar10;
  DefinitionSymbol *pDVar11;
  DefinitionSymbol *pDVar12;
  ConstantValue *lhs;
  ConstantValue *rhs;
  Type *this_01;
  Type *rhs_00;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  pointer ppVar16;
  
  if (this->savedHash == other->savedHash) {
    pDVar11 = InstanceSymbol::getDefinition((this->symbol).ptr);
    pDVar12 = InstanceSymbol::getDefinition((other->symbol).ptr);
    if ((pDVar11 == pDVar12) &&
       ((long)(this->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)(other->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(other->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
      pIVar1 = ((this->symbol).ptr)->body;
      if ((pIVar1->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pIVar1->super_Scope);
      }
      ppPVar2 = (pIVar1->parameters)._M_ptr;
      sVar3 = (pIVar1->parameters)._M_extent._M_extent_value;
      pIVar1 = ((other->symbol).ptr)->body;
      if ((pIVar1->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pIVar1->super_Scope);
      }
      if (sVar3 != 0) {
        ppPVar4 = (pIVar1->parameters)._M_ptr;
        sVar13 = 0;
        do {
          pPVar5 = ppPVar4[sVar13];
          this_00 = (ParameterSymbol *)ppPVar2[sVar13]->symbol;
          if ((this_00->super_ValueSymbol).super_Symbol.kind == Parameter) {
            lhs = ParameterSymbol::getValue(this_00,(SourceRange)ZEXT816(0));
            rhs = ParameterSymbol::getValue
                            ((ParameterSymbol *)pPVar5->symbol,(SourceRange)ZEXT816(0));
            bVar9 = slang::operator==(lhs,rhs);
            if (!bVar9) {
              return false;
            }
          }
          else {
            this_01 = DeclaredType::getType
                                ((DeclaredType *)
                                 &(this_00->super_ValueSymbol).declaredType.dimensions);
            rhs_00 = DeclaredType::getType((DeclaredType *)&pPVar5->symbol[1].location);
            bVar9 = Type::isMatching(this_01,rhs_00);
            if (!bVar9) {
              return false;
            }
          }
          sVar13 = sVar13 + 1;
        } while (sVar3 != sVar13);
      }
      ppVar16 = (this->ifaceKeys).
                super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->ifaceKeys).
          super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == ppVar16) {
        return true;
      }
      lVar15 = 0;
      uVar14 = 0;
      while( true ) {
        ppVar6 = (other->ifaceKeys).
                 super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar9 = operator==((InstanceCacheKey *)((long)&(ppVar16->first).symbol.ptr + lVar15),
                           (InstanceCacheKey *)((long)&(ppVar6->first).symbol.ptr + lVar15));
        if (!bVar9) break;
        lVar7 = *(long *)((long)&ppVar16->second + lVar15);
        lVar8 = *(long *)((long)&ppVar6->second + lVar15);
        if ((lVar7 != 0) == (lVar8 == 0)) {
          return false;
        }
        if (lVar7 != 0) {
          __n = *(size_t *)(lVar7 + 8);
          if (__n != *(size_t *)(lVar8 + 8)) {
            return false;
          }
          if ((__n != 0) &&
             (iVar10 = bcmp(*(void **)(lVar7 + 0x10),*(void **)(lVar8 + 0x10),__n), iVar10 != 0)) {
            return false;
          }
        }
        uVar14 = uVar14 + 1;
        ppVar16 = (this->ifaceKeys).
                  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar15 = lVar15 + 0x30;
        if ((ulong)(((long)(this->ifaceKeys).
                           super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar16 >> 4) *
                   -0x5555555555555555) <= uVar14) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool InstanceCacheKey::operator==(const InstanceCacheKey& other) const {
    if (savedHash != other.savedHash ||
        &symbol->getDefinition() != &other.symbol->getDefinition() ||
        ifaceKeys.size() != other.ifaceKeys.size()) {
        return false;
    }

    auto lparams = symbol->body.getParameters();
    auto rparams = other.symbol->body.getParameters();
    SLANG_ASSERT(lparams.size() == rparams.size());

    for (size_t i = 0; i < lparams.size(); i++) {
        auto lp = lparams[i];
        auto rp = rparams[i];
        SLANG_ASSERT(lp->symbol.kind == rp->symbol.kind);

        if (lp->symbol.kind == SymbolKind::Parameter) {
            if (lp->symbol.as<ParameterSymbol>().getValue() !=
                rp->symbol.as<ParameterSymbol>().getValue()) {
                return false;
            }
        }
        else {
            auto& lt = lp->symbol.as<TypeParameterSymbol>().targetType.getType();
            auto& rt = rp->symbol.as<TypeParameterSymbol>().targetType.getType();
            if (!lt.isMatching(rt))
                return false;
        }
    }

    for (size_t i = 0; i < ifaceKeys.size(); i++) {
        auto& l = ifaceKeys[i];
        auto& r = other.ifaceKeys[i];
        if (l.first != r.first)
            return false;

        if (bool(l.second) != bool(r.second) || (l.second && l.second->name != r.second->name))
            return false;
    }

    return true;
}